

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O1

int json_object_object_to_json_string(json_object *jso,printbuf *pb,int level,int flags)

{
  undefined8 *puVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  char *pcVar7;
  long *plVar8;
  
  printbuf_memappend(pb,"{",1);
  plVar8 = (long *)(*(long *)(jso + 1) + 8);
  bVar6 = true;
  bVar3 = 0;
  do {
    puVar1 = (undefined8 *)*plVar8;
    if (puVar1 == (undefined8 *)0x0) {
      if (!(bool)(~bVar3 & 1) && (flags & 2U) != 0) {
        printbuf_memappend(pb,"\n",1);
        indent(pb,level,flags);
      }
      if ((flags & 3U) == 1) {
        pcVar7 = " }";
        iVar4 = 2;
      }
      else {
        pcVar7 = "}";
        iVar4 = 1;
      }
      iVar4 = printbuf_memappend(pb,pcVar7,iVar4);
      return iVar4;
    }
    pcVar7 = (char *)*puVar1;
    lVar2 = puVar1[2];
    if (!bVar6) {
      printbuf_memappend(pb,",",1);
    }
    if ((flags & 2U) != 0) {
      printbuf_memappend(pb,"\n",1);
    }
    if ((flags & 3U) == 1) {
      printbuf_memappend(pb," ",1);
    }
    indent(pb,level + 1,flags);
    if ((flags & 0x20U) == 0) {
      printbuf_memappend(pb,"\"",1);
      sVar5 = strlen(pcVar7);
      json_escape_str(pb,pcVar7,sVar5,flags);
      pcVar7 = "\"";
      iVar4 = 1;
    }
    else {
      printbuf_memappend(pb,"\x1b[0;34m",7);
      printbuf_memappend(pb,"\"",1);
      sVar5 = strlen(pcVar7);
      json_escape_str(pb,pcVar7,sVar5,flags);
      printbuf_memappend(pb,"\"",1);
      pcVar7 = "\x1b[0m";
      iVar4 = 4;
    }
    printbuf_memappend(pb,pcVar7,iVar4);
    if ((flags & 1U) == 0) {
      pcVar7 = ":";
      iVar4 = 1;
    }
    else {
      pcVar7 = ": ";
      iVar4 = 2;
    }
    printbuf_memappend(pb,pcVar7,iVar4);
    if (lVar2 == 0) {
      pcVar7 = "null";
      if ((flags & 0x20U) != 0) {
        printbuf_memappend(pb,"\x1b[0;35m",7);
        printbuf_memappend(pb,"null",4);
        pcVar7 = "\x1b[0m";
      }
      printbuf_memappend(pb,pcVar7,4);
    }
    else {
      iVar4 = (**(code **)(lVar2 + 8))(lVar2,pb,level + 1);
      if (iVar4 < 0) {
        return -1;
      }
    }
    plVar8 = puVar1 + 3;
    bVar3 = 1;
    bVar6 = false;
  } while( true );
}

Assistant:

static int json_object_object_to_json_string(struct json_object *jso, struct printbuf *pb,
                                             int level, int flags)
{
	int had_children = 0;
	struct json_object_iter iter;

	printbuf_strappend(pb, "{" /*}*/);
	json_object_object_foreachC(jso, iter)
	{
		if (had_children)
		{
			printbuf_strappend(pb, ",");
		}
		if (flags & JSON_C_TO_STRING_PRETTY)
			printbuf_strappend(pb, "\n");
		had_children = 1;
		if (flags & JSON_C_TO_STRING_SPACED && !(flags & JSON_C_TO_STRING_PRETTY))
			printbuf_strappend(pb, " ");
		indent(pb, level + 1, flags);
		if (flags & JSON_C_TO_STRING_COLOR)
			printbuf_strappend(pb, ANSI_COLOR_FG_BLUE);

		printbuf_strappend(pb, "\"");
		json_escape_str(pb, iter.key, strlen(iter.key), flags);
		printbuf_strappend(pb, "\"");

		if (flags & JSON_C_TO_STRING_COLOR)
			printbuf_strappend(pb, ANSI_COLOR_RESET);

		if (flags & JSON_C_TO_STRING_SPACED)
			printbuf_strappend(pb, ": ");
		else
			printbuf_strappend(pb, ":");

		if (iter.val == NULL) {
			if (flags & JSON_C_TO_STRING_COLOR)
				printbuf_strappend(pb, ANSI_COLOR_FG_MAGENTA);
			printbuf_strappend(pb, "null");
			if (flags & JSON_C_TO_STRING_COLOR)
				printbuf_strappend(pb, ANSI_COLOR_RESET);
		} else if (iter.val->_to_json_string(iter.val, pb, level + 1, flags) < 0)
			return -1;
	}
	if ((flags & JSON_C_TO_STRING_PRETTY) && had_children)
	{
		printbuf_strappend(pb, "\n");
		indent(pb, level, flags);
	}
	if (flags & JSON_C_TO_STRING_SPACED && !(flags & JSON_C_TO_STRING_PRETTY))
		return printbuf_strappend(pb, /*{*/ " }");
	else
		return printbuf_strappend(pb, /*{*/ "}");
}